

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_wideshuffle_8(c_v256 a,c_v256 b,c_v256 pattern)

{
  undefined1 auVar1 [16];
  c_v128 cVar2;
  c_v128 cVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  c_v256 *in_RDI;
  undefined1 *puVar35;
  byte in_stack_00000048;
  byte in_stack_00000049;
  byte in_stack_0000004a;
  byte in_stack_0000004b;
  byte in_stack_0000004c;
  byte in_stack_0000004d;
  byte in_stack_0000004e;
  byte in_stack_0000004f;
  byte in_stack_00000050;
  byte in_stack_00000051;
  byte in_stack_00000052;
  byte in_stack_00000053;
  byte in_stack_00000054;
  byte in_stack_00000055;
  byte in_stack_00000056;
  byte in_stack_00000057;
  byte in_stack_00000058;
  byte in_stack_00000059;
  byte in_stack_0000005a;
  byte in_stack_0000005b;
  byte in_stack_0000005c;
  byte in_stack_0000005d;
  byte in_stack_0000005e;
  byte in_stack_0000005f;
  byte in_stack_00000060;
  byte in_stack_00000061;
  byte in_stack_00000062;
  byte in_stack_00000063;
  byte in_stack_00000064;
  byte in_stack_00000065;
  byte in_stack_00000066;
  byte in_stack_00000067;
  
  puVar4 = &stack0x00000008;
  if (in_stack_00000048 < 0x20) {
    puVar4 = &stack0x00000028;
  }
  puVar5 = &stack0x00000008;
  if (in_stack_00000049 < 0x20) {
    puVar5 = &stack0x00000028;
  }
  puVar6 = &stack0x00000008;
  if (in_stack_0000004a < 0x20) {
    puVar6 = &stack0x00000028;
  }
  puVar7 = &stack0x00000008;
  if (in_stack_0000004b < 0x20) {
    puVar7 = &stack0x00000028;
  }
  puVar8 = &stack0x00000008;
  if (in_stack_0000004c < 0x20) {
    puVar8 = &stack0x00000028;
  }
  puVar9 = &stack0x00000008;
  if (in_stack_0000004d < 0x20) {
    puVar9 = &stack0x00000028;
  }
  puVar10 = &stack0x00000008;
  if (in_stack_0000004e < 0x20) {
    puVar10 = &stack0x00000028;
  }
  puVar11 = &stack0x00000008;
  if (in_stack_0000004f < 0x20) {
    puVar11 = &stack0x00000028;
  }
  puVar12 = &stack0x00000008;
  if (in_stack_00000050 < 0x20) {
    puVar12 = &stack0x00000028;
  }
  puVar13 = &stack0x00000008;
  if (in_stack_00000051 < 0x20) {
    puVar13 = &stack0x00000028;
  }
  puVar14 = &stack0x00000008;
  if (in_stack_00000052 < 0x20) {
    puVar14 = &stack0x00000028;
  }
  puVar15 = &stack0x00000008;
  if (in_stack_00000053 < 0x20) {
    puVar15 = &stack0x00000028;
  }
  puVar16 = &stack0x00000008;
  if (in_stack_00000054 < 0x20) {
    puVar16 = &stack0x00000028;
  }
  puVar17 = &stack0x00000008;
  if (in_stack_00000055 < 0x20) {
    puVar17 = &stack0x00000028;
  }
  puVar18 = &stack0x00000008;
  if (in_stack_00000056 < 0x20) {
    puVar18 = &stack0x00000028;
  }
  puVar19 = &stack0x00000008;
  if (in_stack_00000057 < 0x20) {
    puVar19 = &stack0x00000028;
  }
  puVar20 = &stack0x00000008;
  if (in_stack_00000058 < 0x20) {
    puVar20 = &stack0x00000028;
  }
  puVar21 = &stack0x00000008;
  if (in_stack_00000059 < 0x20) {
    puVar21 = &stack0x00000028;
  }
  puVar22 = &stack0x00000008;
  if (in_stack_0000005a < 0x20) {
    puVar22 = &stack0x00000028;
  }
  puVar23 = &stack0x00000008;
  if (in_stack_0000005b < 0x20) {
    puVar23 = &stack0x00000028;
  }
  puVar24 = &stack0x00000008;
  if (in_stack_0000005c < 0x20) {
    puVar24 = &stack0x00000028;
  }
  puVar25 = &stack0x00000008;
  if (in_stack_0000005d < 0x20) {
    puVar25 = &stack0x00000028;
  }
  puVar26 = &stack0x00000008;
  if (in_stack_0000005e < 0x20) {
    puVar26 = &stack0x00000028;
  }
  puVar27 = &stack0x00000008;
  if (in_stack_0000005f < 0x20) {
    puVar27 = &stack0x00000028;
  }
  puVar28 = &stack0x00000008;
  if (in_stack_00000060 < 0x20) {
    puVar28 = &stack0x00000028;
  }
  puVar29 = &stack0x00000008;
  if (in_stack_00000061 < 0x20) {
    puVar29 = &stack0x00000028;
  }
  puVar30 = &stack0x00000008;
  if (in_stack_00000062 < 0x20) {
    puVar30 = &stack0x00000028;
  }
  puVar31 = &stack0x00000008;
  if (in_stack_00000063 < 0x20) {
    puVar31 = &stack0x00000028;
  }
  puVar32 = &stack0x00000008;
  if (in_stack_00000064 < 0x20) {
    puVar32 = &stack0x00000028;
  }
  puVar33 = &stack0x00000008;
  if (in_stack_00000065 < 0x20) {
    puVar33 = &stack0x00000028;
  }
  puVar34 = &stack0x00000008;
  if (in_stack_00000066 < 0x20) {
    puVar34 = &stack0x00000028;
  }
  puVar35 = &stack0x00000008;
  if (in_stack_00000067 < 0x20) {
    puVar35 = &stack0x00000028;
  }
  auVar1 = vpinsrb_avx(ZEXT116((byte)puVar4[in_stack_00000048 & 0x1f]),
                       (uint)(byte)puVar5[in_stack_00000049 & 0x1f],1);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar6[in_stack_0000004a & 0x1f],2);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar7[in_stack_0000004b & 0x1f],3);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar8[in_stack_0000004c & 0x1f],4);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar9[in_stack_0000004d & 0x1f],5);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar10[in_stack_0000004e & 0x1f],6);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar11[in_stack_0000004f & 0x1f],7);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar12[in_stack_00000050 & 0x1f],8);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar13[in_stack_00000051 & 0x1f],9);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar14[in_stack_00000052 & 0x1f],10);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar15[in_stack_00000053 & 0x1f],0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar16[in_stack_00000054 & 0x1f],0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar17[in_stack_00000055 & 0x1f],0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar18[in_stack_00000056 & 0x1f],0xe);
  cVar2 = (c_v128)vpinsrb_avx(auVar1,(uint)(byte)puVar19[in_stack_00000057 & 0x1f],0xf);
  auVar1 = vpinsrb_avx(ZEXT116((byte)puVar20[in_stack_00000058 & 0x1f]),
                       (uint)(byte)puVar21[in_stack_00000059 & 0x1f],1);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar22[in_stack_0000005a & 0x1f],2);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar23[in_stack_0000005b & 0x1f],3);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar24[in_stack_0000005c & 0x1f],4);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar25[in_stack_0000005d & 0x1f],5);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar26[in_stack_0000005e & 0x1f],6);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar27[in_stack_0000005f & 0x1f],7);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar28[in_stack_00000060 & 0x1f],8);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar29[in_stack_00000061 & 0x1f],9);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar30[in_stack_00000062 & 0x1f],10);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar31[in_stack_00000063 & 0x1f],0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar32[in_stack_00000064 & 0x1f],0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar33[in_stack_00000065 & 0x1f],0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)(byte)puVar34[in_stack_00000066 & 0x1f],0xe);
  cVar3 = (c_v128)vpinsrb_avx(auVar1,(uint)(byte)puVar35[in_stack_00000067 & 0x1f],0xf);
  in_RDI->v128[1] = cVar3;
  in_RDI->v128[0] = cVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_wideshuffle_8(c_v256 a, c_v256 b, c_v256 pattern) {
  c_v256 t;
  int c;
  for (c = 0; c < 32; c++)
    t.u8[c] = (pattern.u8[c] < 32
                   ? b.u8
                   : a.u8)[CONFIG_BIG_ENDIAN ? 31 - (pattern.u8[c] & 31)
                                             : pattern.u8[c] & 31];
  return t;
}